

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

nh_bool nh_set_option(char *name,nh_optvalue value,boolean isstring)

{
  boolean bVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = exit_jmp_buf_valid + 1;
  bVar3 = exit_jmp_buf_valid == 0;
  exit_jmp_buf_valid = iVar2;
  if ((bVar3) && (iVar2 = __sigsetjmp(exit_jmp_buf,1), iVar2 != 0)) {
    return '\0';
  }
  bVar1 = set_option(name,value,isstring);
  exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
  return bVar1;
}

Assistant:

boolean nh_set_option(const char *name, union nh_optvalue value, boolean isstring)
{
	boolean rv;
	
	if (!api_entry_checkpoint())
	    return FALSE;
	
	rv = set_option(name, value, isstring);
	
	api_exit();
	return rv;
}